

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<capnp::Response<capnp::DynamicStruct>_> * __thiscall
kj::_::NullableValue<capnp::Response<capnp::DynamicStruct>_>::operator=
          (NullableValue<capnp::Response<capnp::DynamicStruct>_> *this,
          NullableValue<capnp::Response<capnp::DynamicStruct>_> *other)

{
  Response<capnp::DynamicStruct> *params;
  NullableValue<capnp::Response<capnp::DynamicStruct>_> *other_local;
  NullableValue<capnp::Response<capnp::DynamicStruct>_> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<capnp::Response<capnp::DynamicStruct>>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<capnp::Response<capnp::DynamicStruct>>(&(other->field_1).value);
      ctor<capnp::Response<capnp::DynamicStruct>,capnp::Response<capnp::DynamicStruct>>
                (&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }